

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O3

sftp_cmd_lookup * lookup_command(char *name)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = 0x1c;
  iVar5 = -1;
  while( true ) {
    iVar3 = (iVar4 + iVar5) / 2;
    iVar2 = strcmp(name,sftp_lookup[iVar3].name);
    iVar1 = iVar3;
    if ((-1 < iVar2) && (iVar1 = iVar4, iVar5 = iVar3, iVar2 == 0)) break;
    iVar4 = iVar1;
    if (iVar4 - iVar5 < 2) {
      return (sftp_cmd_lookup *)0x0;
    }
  }
  return sftp_lookup + iVar3;
}

Assistant:

const struct sftp_cmd_lookup *lookup_command(const char *name)
{
    int i, j, k, cmp;

    i = -1;
    j = lenof(sftp_lookup);
    while (j - i > 1) {
        k = (j + i) / 2;
        cmp = strcmp(name, sftp_lookup[k].name);
        if (cmp < 0)
            j = k;
        else if (cmp > 0)
            i = k;
        else {
            return &sftp_lookup[k];
        }
    }
    return NULL;
}